

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O2

void Luv32toRGB(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  uint32_t p;
  uint32_t *puVar1;
  float xyz [3];
  float local_2c [3];
  
  puVar1 = (uint32_t *)sp->tbuf;
  for (; 0 < n; n = n + -1) {
    p = *puVar1;
    puVar1 = puVar1 + 1;
    LogLuv32toXYZ(p,local_2c);
    XYZtoRGB24(local_2c,op);
    op = op + 3;
  }
  return;
}

Assistant:

static void Luv32toRGB(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    uint8_t *rgb = (uint8_t *)op;

    while (n-- > 0)
    {
        float xyz[3];

        LogLuv32toXYZ(*luv++, xyz);
        XYZtoRGB24(xyz, rgb);
        rgb += 3;
    }
}